

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

int lys_node_addchild(lys_node *parent,lys_module *module,lys_node *child,int options)

{
  ly_ctx *ctx_00;
  lys_module *plVar1;
  lys_node_inout *plVar2;
  lys_node *plVar3;
  LY_STMT stmt;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  lyext_substmt *local_88;
  lyext_substmt *info;
  void *p;
  int shortcase;
  int type;
  lys_node_augment *aug;
  lys_node_case *c;
  lys_node_inout *out;
  lys_node_inout *in;
  lys_node *log_parent;
  lys_node **pchild;
  lys_node *iter;
  ly_ctx *ctx;
  lys_node *plStack_28;
  int options_local;
  lys_node *child_local;
  lys_module *module_local;
  lys_node *parent_local;
  
  ctx_00 = child->module->ctx;
  p._0_4_ = 0;
  local_88 = (lyext_substmt *)0x0;
  iter = (lys_node *)ctx_00;
  ctx._4_4_ = options;
  plStack_28 = child;
  child_local = (lys_node *)module;
  module_local = (lys_module *)parent;
  if (child == (lys_node *)0x0) {
    __assert_fail("child",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0x2fe,
                  "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *, int)"
                 );
  }
  if (parent == (lys_node *)0x0) {
    if (module == (lys_module *)0x0) {
      __assert_fail("module",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                    ,0x31a,
                    "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *, int)"
                   );
    }
    if ((child->nodetype & (LYS_OUTPUT|LYS_INPUT)) != LYS_UNKNOWN) {
      __assert_fail("!(child->nodetype & (LYS_INPUT | LYS_OUTPUT))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                    ,0x31b,
                    "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *, int)"
                   );
    }
    p._4_4_ = LYS_UNKNOWN;
    in = (lys_node_inout *)0x0;
  }
  else {
    p._4_4_ = parent->nodetype;
    child_local = (lys_node *)parent->module;
    in = (lys_node_inout *)parent;
    if (p._4_4_ == LYS_USES) {
      while( true ) {
        while( true ) {
          bVar7 = false;
          if (in != (lys_node_inout *)0x0) {
            bVar7 = in->nodetype == LYS_USES;
          }
          if (!bVar7) {
            if (in == (lys_node_inout *)0x0) {
              p._4_4_ = LYS_UNKNOWN;
            }
            else {
              p._4_4_ = in->nodetype;
            }
            goto LAB_0018a17f;
          }
          if (in->nodetype == LYS_AUGMENT) break;
          in = (lys_node_inout *)in->parent;
        }
        _shortcase = in;
        if (in->prev == (lys_node *)0x0) break;
        in = (lys_node_inout *)in->prev;
      }
      goto LAB_0018a732;
    }
  }
LAB_0018a17f:
  plVar2 = in;
  if (p._4_4_ == LYS_UNKNOWN) {
    if ((child->nodetype & 0xb9bf) == LYS_UNKNOWN) {
      pcVar6 = strnodetype(child->nodetype);
      ly_vlog(ctx_00,LYE_INCHILDSTMT,LY_VLOG_LYS,plVar2,pcVar6,"(sub)module");
      return 1;
    }
    goto LAB_0018a732;
  }
  if (p._4_4_ == LYS_CONTAINER) {
LAB_0018a2c2:
    if ((child->nodetype & 0xd8bf) == LYS_UNKNOWN) {
      pcVar6 = strnodetype(child->nodetype);
      pcVar5 = strnodetype(in->nodetype);
      ly_vlog(ctx_00,LYE_INCHILDSTMT,LY_VLOG_LYS,plVar2,pcVar6,pcVar5);
      return 1;
    }
    goto LAB_0018a732;
  }
  if (p._4_4_ == LYS_CHOICE) {
    if ((child->nodetype & 0x807f) == LYS_UNKNOWN) {
      pcVar6 = strnodetype(child->nodetype);
      ly_vlog(ctx_00,LYE_INCHILDSTMT,LY_VLOG_LYS,plVar2,pcVar6,"choice");
      return 1;
    }
    p._0_4_ = (uint)(child->nodetype != LYS_CASE);
    goto LAB_0018a732;
  }
  if ((p._4_4_ == LYS_LEAF) || (p._4_4_ == LYS_LEAFLIST)) {
LAB_0018a51a:
    pcVar6 = strnodetype(child->nodetype);
    pcVar5 = strnodetype(in->nodetype);
    ly_vlog(ctx_00,LYE_INCHILDSTMT,LY_VLOG_LYS,plVar2,pcVar6,pcVar5);
    plVar3 = iter;
    pcVar6 = strnodetype(in->nodetype);
    ly_vlog((ly_ctx *)plVar3,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
            "The \"%s\" statement cannot have any data substatement.",pcVar6);
    return 1;
  }
  if (p._4_4_ == LYS_LIST) goto LAB_0018a2c2;
  if (p._4_4_ == LYS_ANYXML) goto LAB_0018a51a;
  if (p._4_4_ == LYS_CASE) {
    if ((child->nodetype & 0x903f) == LYS_UNKNOWN) {
      pcVar6 = strnodetype(child->nodetype);
      ly_vlog(ctx_00,LYE_INCHILDSTMT,LY_VLOG_LYS,plVar2,pcVar6,"case");
      return 1;
    }
    goto LAB_0018a732;
  }
  if (p._4_4_ == LYS_NOTIF) {
LAB_0018a342:
    if ((child->nodetype & 0x983f) == LYS_UNKNOWN) {
      pcVar6 = strnodetype(child->nodetype);
      pcVar5 = strnodetype(in->nodetype);
      ly_vlog(ctx_00,LYE_INCHILDSTMT,LY_VLOG_LYS,plVar2,pcVar6,pcVar5);
      return 1;
    }
  }
  else {
    if (p._4_4_ != LYS_RPC) {
      if ((p._4_4_ == LYS_INPUT) || (p._4_4_ == LYS_OUTPUT)) goto LAB_0018a342;
      if ((p._4_4_ == LYS_GROUPING) || (p._4_4_ == LYS_USES)) goto LAB_0018a2c2;
      if (p._4_4_ == LYS_AUGMENT) {
        if ((child->nodetype & 0xd0ff) == LYS_UNKNOWN) {
          pcVar6 = strnodetype(child->nodetype);
          pcVar5 = strnodetype(in->nodetype);
          ly_vlog(ctx_00,LYE_INCHILDSTMT,LY_VLOG_LYS,plVar2,pcVar6,pcVar5);
          return 1;
        }
        goto LAB_0018a732;
      }
      if (p._4_4_ != LYS_ACTION) {
        if (p._4_4_ == LYS_ANYDATA) goto LAB_0018a51a;
        if (p._4_4_ == LYS_EXT) {
          stmt = lys_snode2stmt(child->nodetype);
          info = (lyext_substmt *)
                 lys_ext_complex_get_substmt(stmt,(lys_ext_instance_complex *)in,&local_88);
          plVar3 = iter;
          plVar2 = in;
          if (info == (lyext_substmt *)0x0) {
            pcVar6 = strnodetype(plStack_28->nodetype);
            ly_vlog((ly_ctx *)plVar3,LYE_INCHILDSTMT,LY_VLOG_LYS,plVar2,pcVar6,
                    *(undefined8 *)in->name);
            return 1;
          }
        }
        goto LAB_0018a732;
      }
    }
    if ((child->nodetype & (LYS_GROUPING|LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) {
      pcVar6 = strnodetype(child->nodetype);
      ly_vlog(ctx_00,LYE_INCHILDSTMT,LY_VLOG_LYS,plVar2,pcVar6,"rpc");
      return 1;
    }
  }
LAB_0018a732:
  if (((*(uint *)(child_local->name + 0x5c) & 2) == 0) &&
     (iVar4 = lys_check_id(plStack_28,(lys_node *)module_local,(lys_module *)child_local),
     iVar4 != 0)) {
    parent_local._4_4_ = 1;
  }
  else {
    if (plStack_28->parent != (lys_node *)0x0) {
      lys_node_unlink(plStack_28);
    }
    if (((plStack_28->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) ||
       (*(int *)&module_local->filepath == 0x10000)) {
      if ((uint)p != 0) {
        aug = (lys_node_augment *)calloc(1,0x70);
        if (aug == (lys_node_augment *)0x0) {
          ly_log((ly_ctx *)iter,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_node_addchild");
          return 1;
        }
        pcVar6 = lydict_insert((ly_ctx *)child_local->name,plStack_28->name,0);
        aug->target_name = pcVar6;
        aug->flags = 0x40;
        if ((ctx._4_4_ & 3) == 0) {
          aug->flags = aug->flags | *(ushort *)&module_local->dsc & 3;
        }
        aug->module = (lys_module *)child_local;
        aug->nodetype = LYS_CASE;
        aug->target = (lys_node *)aug;
        lys_node_addchild((lys_node *)module_local,(lys_module *)child_local,(lys_node *)aug,
                          ctx._4_4_);
        module_local = (lys_module *)aug;
      }
      if (module_local == (lys_module *)0x0) {
        if (*(long *)&child_local[1].nodetype == 0) {
          *(lys_node **)&child_local[1].nodetype = plStack_28;
        }
        else {
          *(lys_node **)(*(long *)(*(long *)&child_local[1].nodetype + 0x58) + 0x50) = plStack_28;
          plStack_28->prev = *(lys_node **)(*(long *)&child_local[1].nodetype + 0x58);
          *(lys_node **)(*(long *)&child_local[1].nodetype + 0x58) = plStack_28;
        }
      }
      else {
        log_parent = (lys_node *)lys_child((lys_node *)module_local,plStack_28->nodetype);
        if (log_parent == (lys_node *)0x0) {
          __assert_fail("pchild",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                        ,0x3ba,
                        "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *, int)"
                       );
        }
        plStack_28->parent = (lys_node *)module_local;
        if ((lys_node *)log_parent->name == (lys_node *)0x0) {
          log_parent->name = (char *)plStack_28;
          pchild = (lys_node **)plStack_28;
        }
        else {
          pchild = (lys_node **)((lys_node *)log_parent->name)->prev;
          ((lys_node *)pchild)->next = plStack_28;
          plStack_28->prev = (lys_node *)pchild;
        }
        while (pchild[10] != (lys_node *)0x0) {
          pchild = (lys_node **)pchild[10];
          ((lys_node *)pchild)->parent = (lys_node *)module_local;
        }
        ((lys_node *)log_parent->name)->prev = (lys_node *)pchild;
      }
    }
    else {
      for (pchild = *(lys_node ***)&module_local->ident_size;
          (pchild != (lys_node **)0x0 && (*(LYS_NODE *)(pchild + 7) != plStack_28->nodetype));
          pchild = (lys_node **)pchild[10]) {
      }
      if (pchild == (lys_node **)0x0) {
        __assert_fail("iter",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                      ,0x385,
                      "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *, int)"
                     );
      }
      if (*(lys_node ***)&module_local->ident_size == pchild) {
        *(lys_node **)&module_local->ident_size = plStack_28;
      }
      else {
        pchild[0xb]->next = plStack_28;
      }
      plStack_28->prev = pchild[0xb];
      plStack_28->next = pchild[10];
      if (pchild[10] == (lys_node *)0x0) {
        *(lys_node **)(*(long *)&module_local->ident_size + 0x58) = plStack_28;
      }
      else {
        pchild[10]->prev = plStack_28;
      }
      plStack_28->parent = (lys_node *)module_local;
      pchild[10] = (lys_node *)0x0;
      pchild[0xb] = (lys_node *)pchild;
      pchild[8] = (lys_node *)0x0;
      lys_node_free((lys_node *)pchild,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
    }
    pchild = (lys_node **)module_local;
    while( true ) {
      bVar7 = false;
      if (pchild != (lys_node **)0x0) {
        bVar7 = ((ulong)pchild[7] & 0x12800) == 0;
      }
      if (!bVar7) break;
      pchild = (lys_node **)pchild[8];
    }
    if ((module_local != (lys_module *)0x0) && (pchild == (lys_node **)0x0)) {
      pchild = (lys_node **)plStack_28;
      while( true ) {
        bVar7 = false;
        if (pchild != (lys_node **)0x0) {
          bVar7 = ((ulong)pchild[7] & 0x780) == 0;
        }
        if (!bVar7) break;
        pchild = (lys_node **)pchild[8];
      }
      if (((pchild == (lys_node **)0x0) && (((ulong)module_local->dsc & 2) != 0)) &&
         ((plStack_28->flags & 1) != 0)) {
        ly_vlog((ly_ctx *)iter,LYE_INARG,LY_VLOG_LYS,plStack_28,"true","config");
        ly_vlog((ly_ctx *)iter,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                "State nodes cannot have configuration nodes as children.");
        return 1;
      }
    }
    if (((plStack_28->nodetype &
         (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CHOICE|LYS_CONTAINER)) != LYS_UNKNOWN) &&
       ((plStack_28->flags & 0x80) != 0)) {
      for (pchild = (lys_node **)module_local; pchild != (lys_node **)0x0;
          pchild = (lys_node **)lys_parent((lys_node *)pchild)) {
        if (((ulong)pchild[7] & 0x11) != 0) {
          if (((ulong)pchild[3] & 0x80) != 0) break;
          *(ushort *)(pchild + 3) = *(ushort *)(pchild + 3) | 0x80;
        }
      }
    }
    if (((plStack_28->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) &&
       (plStack_28->child == (lys_node *)0x0)) {
      out = (lys_node_inout *)calloc(1,0x78);
      c = (lys_node_case *)calloc(1,0x78);
      if ((out == (lys_node_inout *)0x0) || (c == (lys_node_case *)0x0)) {
        ly_log((ly_ctx *)iter,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lys_node_addchild");
        free(out);
        free(c);
        return 1;
      }
      out->nodetype = LYS_INPUT;
      pcVar6 = lydict_insert(plStack_28->module->ctx,"input",5);
      out->name = pcVar6;
      c->nodetype = LYS_OUTPUT;
      pcVar6 = lydict_insert(plStack_28->module->ctx,"output",6);
      c->name = pcVar6;
      plVar1 = plStack_28->module;
      c->module = plVar1;
      out->module = plVar1;
      c->parent = plStack_28;
      out->parent = plStack_28;
      c->flags = 0x40;
      out->flags = 0x40;
      out->next = (lys_node *)c;
      out->prev = (lys_node *)c;
      c->prev = (lys_node *)out;
      plStack_28->child = (lys_node *)out;
    }
    parent_local._4_4_ = 0;
  }
  return parent_local._4_4_;
}

Assistant:

int
lys_node_addchild(struct lys_node *parent, struct lys_module *module, struct lys_node *child, int options)
{
    struct ly_ctx *ctx = child->module->ctx;
    struct lys_node *iter, **pchild, *log_parent;
    struct lys_node_inout *in, *out;
    struct lys_node_case *c;
    struct lys_node_augment *aug;
    int type, shortcase = 0;
    void *p;
    struct lyext_substmt *info = NULL;

    assert(child);

    if (parent) {
        type = parent->nodetype;
        module = parent->module;
        log_parent = parent;

        if (type == LYS_USES) {
            /* we are adding children to uses -> we must be copying grouping contents into it, so properly check the parent */
            while (log_parent && (log_parent->nodetype == LYS_USES)) {
                if (log_parent->nodetype == LYS_AUGMENT) {
                    aug = (struct lys_node_augment *)log_parent;
                    if (!aug->target) {
                        /* unresolved augment, just pass the node type check */
                        goto skip_nodetype_check;
                    }
                    log_parent = aug->target;
                } else {
                    log_parent = log_parent->parent;
                }
            }
            if (log_parent) {
                type = log_parent->nodetype;
            } else {
                type = 0;
            }
        }
    } else {
        assert(module);
        assert(!(child->nodetype & (LYS_INPUT | LYS_OUTPUT)));
        type = 0;
        log_parent = NULL;
    }

    /* checks */
    switch (type) {
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_GROUPING:
    case LYS_USES:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_GROUPING | LYS_LEAF |
                 LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_ACTION | LYS_NOTIF))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), strnodetype(log_parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_GROUPING | LYS_LEAF |
                 LYS_LEAFLIST | LYS_LIST | LYS_USES))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), strnodetype(log_parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_CHOICE:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_CHOICE))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), "choice");
            return EXIT_FAILURE;
        }
        if (child->nodetype != LYS_CASE) {
            shortcase = 1;
        }
        break;
    case LYS_CASE:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_USES))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), "case");
            return EXIT_FAILURE;
        }
        break;
    case LYS_RPC:
    case LYS_ACTION:
        if (!(child->nodetype & (LYS_INPUT | LYS_OUTPUT | LYS_GROUPING))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), "rpc");
            return EXIT_FAILURE;
        }
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_ANYXML:
    case LYS_ANYDATA:
        LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), strnodetype(log_parent->nodetype));
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "The \"%s\" statement cannot have any data substatement.",
               strnodetype(log_parent->nodetype));
        return EXIT_FAILURE;
    case LYS_AUGMENT:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CASE | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF
                | LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_ACTION | LYS_NOTIF))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), strnodetype(log_parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_UNKNOWN:
        /* top level */
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_GROUPING
                | LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_RPC | LYS_NOTIF | LYS_AUGMENT))) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype), "(sub)module");
            return EXIT_FAILURE;
        }
        break;
    case LYS_EXT:
        /* plugin-defined */
        p = lys_ext_complex_get_substmt(lys_snode2stmt(child->nodetype), (struct lys_ext_instance_complex*)log_parent, &info);
        if (!p) {
            LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, log_parent, strnodetype(child->nodetype),
                   ((struct lys_ext_instance_complex*)log_parent)->def->name);
            return EXIT_FAILURE;
        }
        /* TODO check cardinality */
        break;
    }

skip_nodetype_check:
    /* check identifier uniqueness */
    if (!(module->ctx->models.flags & LY_CTX_TRUSTED) && lys_check_id(child, parent, module)) {
        return EXIT_FAILURE;
    }

    if (child->parent) {
        lys_node_unlink(child);
    }

    if ((child->nodetype & (LYS_INPUT | LYS_OUTPUT)) && parent->nodetype != LYS_EXT) {
        /* find the implicit input/output node */
        LY_TREE_FOR(parent->child, iter) {
            if (iter->nodetype == child->nodetype) {
                break;
            }
        }
        assert(iter);

        /* switch the old implicit node (iter) with the new one (child) */
        if (parent->child == iter) {
            /* first child */
            parent->child = child;
        } else {
            iter->prev->next = child;
        }
        child->prev = iter->prev;
        child->next = iter->next;
        if (iter->next) {
            iter->next->prev = child;
        } else {
            /* last child */
            parent->child->prev = child;
        }
        child->parent = parent;

        /* isolate the node and free it */
        iter->next = NULL;
        iter->prev = iter;
        iter->parent = NULL;
        lys_node_free(iter, NULL, 0);
    } else {
        if (shortcase) {
            /* create the implicit case to allow it to serve as a target of the augments,
             * it won't be printed, but it will be present in the tree */
            c = calloc(1, sizeof *c);
            LY_CHECK_ERR_RETURN(!c, LOGMEM(ctx), EXIT_FAILURE);
            c->name = lydict_insert(module->ctx, child->name, 0);
            c->flags = LYS_IMPLICIT;
            if (!(options & (LYS_PARSE_OPT_CFG_IGNORE | LYS_PARSE_OPT_CFG_NOINHERIT))) {
                /* get config flag from parent */
                c->flags |= parent->flags & LYS_CONFIG_MASK;
            }
            c->module = module;
            c->nodetype = LYS_CASE;
            c->prev = (struct lys_node*)c;
            lys_node_addchild(parent, module, (struct lys_node*)c, options);
            parent = (struct lys_node*)c;
        }
        /* connect the child correctly */
        if (!parent) {
            if (module->data) {
                module->data->prev->next = child;
                child->prev = module->data->prev;
                module->data->prev = child;
            } else {
                module->data = child;
            }
        } else {
            pchild = lys_child(parent, child->nodetype);
            assert(pchild);

            child->parent = parent;
            if (!(*pchild)) {
                /* the only/first child of the parent */
                *pchild = child;
                iter = child;
            } else {
                /* add a new child at the end of parent's child list */
                iter = (*pchild)->prev;
                iter->next = child;
                child->prev = iter;
            }
            while (iter->next) {
                iter = iter->next;
                iter->parent = parent;
            }
            (*pchild)->prev = iter;
        }
    }

    /* check config value (but ignore them in groupings and augments) */
    for (iter = parent; iter && !(iter->nodetype & (LYS_GROUPING | LYS_AUGMENT | LYS_EXT)); iter = iter->parent);
    if (parent && !iter) {
        for (iter = child; iter && !(iter->nodetype & (LYS_NOTIF | LYS_INPUT | LYS_OUTPUT | LYS_RPC)); iter = iter->parent);
        if (!iter && (parent->flags & LYS_CONFIG_R) && (child->flags & LYS_CONFIG_W)) {
            LOGVAL(ctx, LYE_INARG, LY_VLOG_LYS, child, "true", "config");
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "State nodes cannot have configuration nodes as children.");
            return EXIT_FAILURE;
        }
    }

    /* propagate information about status data presence */
    if ((child->nodetype & (LYS_CONTAINER | LYS_CHOICE | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA)) &&
            (child->flags & LYS_INCL_STATUS)) {
        for(iter = parent; iter; iter = lys_parent(iter)) {
            /* store it only into container or list - the only data inner nodes */
            if (iter->nodetype & (LYS_CONTAINER | LYS_LIST)) {
                if (iter->flags & LYS_INCL_STATUS) {
                    /* done, someone else set it already from here */
                    break;
                }
                /* set flag about including status data */
                iter->flags |= LYS_INCL_STATUS;
            }
        }
    }

    /* create implicit input/output nodes to have available them as possible target for augment */
    if ((child->nodetype & (LYS_RPC | LYS_ACTION)) && !child->child) {
        in = calloc(1, sizeof *in);
        out = calloc(1, sizeof *out);
        if (!in || !out) {
            LOGMEM(ctx);
            free(in);
            free(out);
            return EXIT_FAILURE;
        }
        in->nodetype = LYS_INPUT;
        in->name = lydict_insert(child->module->ctx, "input", 5);
        out->nodetype = LYS_OUTPUT;
        out->name = lydict_insert(child->module->ctx, "output", 6);
        in->module = out->module = child->module;
        in->parent = out->parent = child;
        in->flags = out->flags = LYS_IMPLICIT;
        in->next = (struct lys_node *)out;
        in->prev = (struct lys_node *)out;
        out->prev = (struct lys_node *)in;
        child->child = (struct lys_node *)in;
    }
    return EXIT_SUCCESS;
}